

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O2

void __thiscall Start::StartGameNowTigersBattle10(Start *this,double *credits,uint *bet)

{
  uint *bet_00;
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  Start *this_00;
  char cVar4;
  double credit;
  PrintGameName printWelcome;
  uint bet_1;
  string p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  Bet settingBet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector;
  Bet currentBet;
  PaytableTigersBattle paytableForGame;
  Matrix myMatrix;
  PrintGameName local_169;
  uint *local_168;
  uint local_15c;
  char *local_158;
  long local_150;
  char local_148 [16];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_138;
  Start *local_120;
  double local_118;
  Start local_110;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_e8;
  Bet local_c8;
  PaytableTigersBattle local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  Matrix local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_138.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = this;
  Matrix::getVectorMatrix(&local_b8._myVectorInPaytableTigersBattle,&this->super_Matrix);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&local_138,&local_b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b8._myVectorInPaytableTigersBattle);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = '\0';
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_90,&local_138);
  local_168 = bet;
  PaytableTigersBattle::PaytableTigersBattle(&local_b8,&local_90,*credits,*bet);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_90);
  while (2.0 <= *credits) {
    if (*credits < (double)*local_168) {
      *local_168 = 2;
      poVar3 = std::operator<<((ostream *)&std::cout,"Changing Bet to min: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," Euro!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'p\' to Start a Game!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'e\' to Change the Bet!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'i\' to see the Paytable!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'c\' to Cashout!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'a\' to add credit!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'q\' for More Games!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press \'l\' To Change Lines!");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar3 = std::ostream::_M_insert<double>(*credits);
    poVar3 = std::operator<<(poVar3," Euro!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator>>((istream *)&std::cin,(string *)&local_158);
    cVar4 = *local_158;
    if (local_150 == 1 && cVar4 == 'p') {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      *credits = *credits - (double)*local_168;
      Matrix::RandomNumbersInMatrix(&local_48,&local_120->super_Matrix,&local_138);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      poVar3 = std::operator<<((ostream *)&std::cout,"---------------------------------------------"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout," ");
      std::endl<char,std::char_traits<char>>(poVar3);
      Matrix::outPutMatrix(&local_120->super_Matrix,&local_138);
      this_00 = (Start *)std::operator<<((ostream *)&std::cout,
                                         "---------------------------------------------");
      std::endl<char,std::char_traits<char>>((ostream *)this_00);
      checkForCreditsAndBetSuperFire10(this_00,credits,local_168);
      outputCreditsAndBetCurrent(this_00,credits,local_168);
      PaytableTigersBattle::PaytableTigersBattleWin10(&local_b8,&local_138,credits,local_168);
      cVar4 = *local_158;
    }
    if (local_150 == 1 && cVar4 == 'e') {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      bet_00 = local_168;
      Bet::Bet((Bet *)&local_110,*local_168,*credits);
      Bet::selectBetTigersBattle10((Bet *)&local_110,bet_00,credits);
      Bet::~Bet((Bet *)&local_110);
      cVar4 = *local_158;
    }
    if ((cVar4 == 'i') && (local_150 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PaytableTigersBattle::PaytableTigersBattleWinInfo10(&local_b8);
      cVar4 = *local_158;
    }
    if ((cVar4 == 'c') && (local_150 == 1)) {
      if (*credits <= 0.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar3 = std::ostream::_M_insert<double>(*credits);
        poVar3 = std::operator<<(poVar3," Euro!");
        std::endl<char,std::char_traits<char>>(poVar3);
        *credits = 0.0;
      }
    }
    cVar4 = *local_158;
    if (local_150 == 1 && cVar4 == 'g') {
      Gamble::Gamble((Gamble *)&local_110);
      Gamble::GambleInfoScreen((Gamble *)&local_110);
      Gamble::~Gamble((Gamble *)&local_110);
      cVar4 = *local_158;
    }
    if (local_150 == 1 && cVar4 == 'a') {
      CreditField::CreditField((CreditField *)&local_110);
      CreditField::AddCredit((CreditField *)&local_110,credits);
      CreditField::~CreditField((CreditField *)&local_110);
      cVar4 = *local_158;
    }
    if ((cVar4 == 'q') && (local_150 == 1)) {
      SelectGame::SelectGame((SelectGame *)&local_110);
      SelectGame::selectGame_Welcome((SelectGame *)&local_110);
      SelectGame::selectGame_Games((SelectGame *)&local_110);
      SelectGame::selectGame_Option((SelectGame *)&local_110,credits);
      SelectGame::~SelectGame((SelectGame *)&local_110);
      cVar4 = *local_158;
    }
    if ((cVar4 == 'l') && (local_150 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_169);
      PrintGameName::PrintGameNameWelcomeTigersBattle5(&local_169);
      credit = *credits;
      if (credit < 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        CreditField::CreditField((CreditField *)&local_110);
        CreditField::AddCredit((CreditField *)&local_110,credits);
        CreditField::~CreditField((CreditField *)&local_110);
        credit = *credits;
      }
      local_15c = 0;
      Bet::Bet(&local_c8,0,credit);
      Bet::selectBetTigersBattle5(&local_c8,&local_15c,credits);
      local_e8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_60,&local_e8);
      Matrix::Matrix(&local_78,&local_60);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      uVar1 = local_15c;
      local_118 = *credits;
      Matrix::Matrix(&local_110.super_Matrix);
      local_110._credits = local_118;
      local_110._bet = uVar1;
      StartGameNowTigersBattle5(&local_110,credits,&local_15c);
      Matrix::~Matrix(&local_110.super_Matrix);
      Matrix::~Matrix(&local_78);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_e8);
      Bet::~Bet(&local_c8);
      PrintGameName::~PrintGameName(&local_169);
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(");
      std::endl<char,std::char_traits<char>>(poVar3);
      CreditField::CreditField((CreditField *)&local_e8);
      CreditField::AddCredit((CreditField *)&local_e8,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"You need to add atleast 2 Euro!");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<((ostream *)&std::cout,"Cashout: ");
        poVar3 = std::ostream::_M_insert<double>(*credits);
        poVar3 = std::operator<<(poVar3," Euro.");
        std::endl<char,std::char_traits<char>>(poVar3);
        *credits = 0.0;
        SelectGame::SelectGame((SelectGame *)&local_110);
        SelectGame::selectGame_Welcome((SelectGame *)&local_110);
        SelectGame::selectGame_Games((SelectGame *)&local_110);
        SelectGame::selectGame_Option((SelectGame *)&local_110,credits);
        SelectGame::~SelectGame((SelectGame *)&local_110);
      }
      CreditField::~CreditField((CreditField *)&local_e8);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&local_138);
  }
  PaytableTigersBattle::~PaytableTigersBattle(&local_b8);
  std::__cxx11::string::~string((string *)&local_158);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_138);
  return;
}

Assistant:

void Start::StartGameNowTigersBattle10(double& credits, unsigned int& bet) {

	std::vector<std::vector<int>>myVectorInStart;
	myVectorInStart = getVectorMatrix();
	std::string p;

	unsigned int minBet = 2;
	PaytableTigersBattle paytableForGame(myVectorInStart, credits, bet);
	while (credits >= minBet) {
		if (credits < bet && credits >= minBet) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet << " Euro!" << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		std::cout << "Press 'p' to Start a Game!" << std::endl;
		std::cout << "Press 'e' to Change the Bet!" << std::endl;
		std::cout << "Press 'i' to see the Paytable!" << std::endl;
		std::cout << "Press 'c' to Cashout!" << std::endl;
		std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
		std::cout << "Press 'a' to add credit!" << std::endl;
		std::cout << "Press 'q' for More Games!" << std::endl;
		std::cout << "Press 'l' To Change Lines!" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "********************************************************************************************************************" << std::endl;

		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size() == 1) {
			//clears screen
			if (system("CLS")) system("clear");

			takeCreditsWithBet(credits, bet);
			RandomNumbersInMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBetSuperFire10(credits, bet);
			outputCreditsAndBetCurrent(credits, bet);
			paytableForGame.PaytableTigersBattleWin10(myVectorInStart, credits, bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBetTigersBattle10(bet, credits);
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			paytableForGame.PaytableTigersBattleWinInfo10();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {

			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' && p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
		if (p[0] == 'l' && p.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeTigersBattle5(); // changed
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetTigersBattle5(bet, credits); //Changing to 5 Lines bet 1 to 5 

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowTigersBattle5(credits, bet);
		}

		if (credits < 1) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 2 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}

		myVectorInStart.clear();
	}
}